

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  lzx_br *br;
  lzx_stream *strm;
  undefined1 *puVar1;
  z_streamp strm_00;
  undefined1 uVar2;
  short sVar3;
  wchar_t wVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  undefined4 uVar11;
  bool bVar12;
  uint uVar13;
  ssize_t sVar14;
  ushort uVar15;
  wchar_t wVar16;
  uint uVar17;
  uint uVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  int iVar22;
  void *pvVar23;
  void *pvVar24;
  char *pcVar25;
  ulong uVar26;
  int64_t iVar27;
  byte *pbVar28;
  undefined4 *puVar29;
  void *pvVar30;
  undefined4 uVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  byte bVar37;
  int iVar38;
  ulong uVar39;
  undefined1 *__dest;
  undefined1 *puVar40;
  uint uVar41;
  void *pvVar42;
  uint uVar43;
  wchar_t wVar44;
  uint uVar45;
  long lVar46;
  size_t __n;
  char cVar47;
  uint local_184;
  uint local_170;
  uint local_154;
  uint local_12c;
  ssize_t bytes_avail;
  ssize_t sStack_c0;
  long local_78;
  int local_6c;
  long local_68;
  long local_60;
  long local_58;
  ssize_t *local_50;
  long local_48;
  byte *local_40;
  ssize_t bytes_avail_1;
  
  pvVar23 = a->format->data;
  wVar16 = cab_next_cfdata(a);
  if (wVar16 < L'\0') {
    *avail = (long)wVar16;
    return (void *)0x0;
  }
  lVar7 = *(long *)((long)pvVar23 + 0x28);
  sVar3 = *(short *)(lVar7 + 6);
  if (sVar3 == 3) {
    pvVar23 = a->format->data;
    lVar7 = *(long *)((long)pvVar23 + 0x38);
    pvVar24 = *(void **)((long)pvVar23 + 0xa0);
    if (pvVar24 == (void *)0x0) {
      *(undefined8 *)((long)pvVar23 + 0xa8) = 0x8000;
      pvVar24 = malloc(0x8000);
      *(void **)((long)pvVar23 + 0xa0) = pvVar24;
      if (pvVar24 == (void *)0x0) {
        pcVar25 = "No memory for CAB reader";
        iVar22 = 0xc;
        goto LAB_0032467b;
      }
    }
    uVar26 = (ulong)*(ushort *)(lVar7 + 0xc);
    if (*(ushort *)(lVar7 + 0xc) == *(ushort *)(lVar7 + 8)) {
      uVar15 = *(ushort *)(lVar7 + 0xe);
      *avail = uVar26 - uVar15;
      return (void *)((long)pvVar24 + (ulong)uVar15);
    }
    if (*(char *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) == '\0') {
      uVar15 = *(ushort *)(*(long *)((long)pvVar23 + 0x28) + 8);
      puVar29 = *(undefined4 **)((long)pvVar23 + 0x1b8);
      if (puVar29 == (undefined4 *)0x0) {
        puVar29 = (undefined4 *)calloc(1,0x220);
        *(undefined4 **)((long)pvVar23 + 0x1b8) = puVar29;
        if (puVar29 != (undefined4 *)0x0) goto LAB_00324226;
      }
      else {
LAB_00324226:
        puVar29[0x87] = 0xffffffe7;
        if (0xfffffff8 < uVar15 - 0x16) {
          puVar29[0x87] = 0xffffffe2;
          iVar22 = puVar29[1];
          uVar43 = slots[uVar15 - 0xf];
          iVar38 = 1 << ((byte)uVar15 & 0x1f);
          puVar29[1] = iVar38;
          puVar29[2] = iVar38 + -1;
          if ((*(void **)(puVar29 + 4) == (void *)0x0) || (iVar22 != iVar38)) {
            free(*(void **)(puVar29 + 4));
            pvVar24 = malloc((long)(int)puVar29[1]);
            *(void **)(puVar29 + 4) = pvVar24;
            if (pvVar24 != (void *)0x0) {
              free(*(void **)(puVar29 + 0x18));
              pvVar24 = malloc((long)(int)uVar43 * 8);
              *(void **)(puVar29 + 0x18) = pvVar24;
              if (pvVar24 != (void *)0x0) {
                lzx_huffman_free((huffman *)(puVar29 + 0x52));
                goto LAB_003242cd;
              }
            }
          }
          else {
LAB_003242cd:
            for (lVar34 = 0; lVar34 != 0x12; lVar34 = lVar34 + 1) {
              *(int *)((long)&bytes_avail + lVar34 * 4) = 1 << ((byte)lVar34 & 0x1f);
            }
            uVar36 = 0;
            if (0 < (int)uVar43) {
              uVar36 = (ulong)uVar43;
            }
            iVar22 = 0;
            uVar17 = 0;
            for (uVar39 = 0; uVar39 != uVar36; uVar39 = uVar39 + 1) {
              if (uVar17 == 0) {
                iVar22 = (int)uVar39;
LAB_003245b3:
                uVar17 = 0xfffffffe;
                for (iVar38 = iVar22; iVar38 != 0; iVar38 = iVar38 >> 1) {
                  uVar17 = uVar17 + 1;
                }
                if ((int)uVar17 < 1) {
                  uVar17 = 0;
                }
              }
              else {
                iVar22 = iVar22 + *(int *)((long)&bytes_avail + (ulong)uVar17 * 4);
                if (uVar17 < 0x11) goto LAB_003245b3;
              }
              lVar34 = *(long *)(puVar29 + 0x18);
              *(int *)(lVar34 + uVar39 * 8) = iVar22;
              *(uint *)(lVar34 + 4 + uVar39 * 8) = uVar17;
            }
            puVar29[6] = 0;
            *puVar29 = 0;
            *(undefined8 *)(puVar29 + 0x1a) = 0;
            puVar29[0x1c] = 0;
            puVar29[0x12] = 1;
            *(undefined8 *)(puVar29 + 0x10) = 0x100000001;
            wVar16 = lzx_huffman_init((huffman *)(puVar29 + 0x1e),8,L'\b');
            if ((((wVar16 == L'\0') &&
                 (wVar16 = lzx_huffman_init((huffman *)(puVar29 + 0x6c),0x14,L'\n'), wVar16 == L'\0'
                 )) && (wVar16 = lzx_huffman_init((huffman *)(puVar29 + 0x52),
                                                  (long)(int)(uVar43 * 8 + 0x100),L'\x10'),
                       wVar16 == L'\0')) &&
               (wVar16 = lzx_huffman_init((huffman *)(puVar29 + 0x38),0xf9,L'\x10'), wVar16 == L'\0'
               )) {
              puVar29[0x87] = 0;
              *(undefined1 *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) = 1;
              goto LAB_00322ef8;
            }
          }
        }
      }
      pcVar25 = "Can\'t initialize LZX decompression.";
      iVar22 = -1;
LAB_0032467b:
      archive_set_error(&a->archive,iVar22,pcVar25);
      *avail = -0x1e;
      return (void *)0x0;
    }
LAB_00322ef8:
    lVar34 = *(long *)((long)pvVar23 + 0x1b8);
    *(undefined4 *)(lVar34 + 0x70) = 0;
    strm = (lzx_stream *)((long)pvVar23 + 0x188);
    *(undefined1 *)(lVar34 + 0x75) = 0;
    *(ulong *)((long)pvVar23 + 0x1b0) = uVar26;
LAB_00322f1f:
    uVar15 = *(ushort *)(lVar7 + 8);
    lVar34 = uVar15 - uVar26;
    if (lVar34 != 0 && (long)uVar26 <= (long)(ulong)uVar15) {
      *(ulong *)((long)pvVar23 + 0x1a0) = uVar26 + *(long *)((long)pvVar23 + 0xa0);
      *(long *)((long)pvVar23 + 0x1a8) = lVar34;
      pbVar28 = (byte *)__archive_read_ahead(a,1,&bytes_avail_1);
      if (0 < bytes_avail_1) {
        uVar26 = (ulong)*(ushort *)(lVar7 + 6);
        if (uVar26 < (ulong)bytes_avail_1) {
          bytes_avail_1 = uVar26;
        }
        sVar14 = bytes_avail_1;
        *(byte **)((long)pvVar23 + 0x188) = pbVar28;
        *(ssize_t *)((long)pvVar23 + 400) = bytes_avail_1;
        *(undefined8 *)((long)pvVar23 + 0x198) = 0;
        piVar8 = *(int **)((long)pvVar23 + 0x1b8);
        uVar43 = piVar8[0x87];
        if (uVar43 == 0) {
          local_40 = pbVar28;
          if (((bytes_avail_1 != 0) && (*(char *)((long)piVar8 + 0x75) != '\0')) &&
             (iVar22 = piVar8[0x1c], iVar22 + -0x41 < -0x10)) {
            *(ulong *)(piVar8 + 0x1a) =
                 (ulong)*(byte *)(piVar8 + 0x1d) |
                 (ulong)*pbVar28 << 8 | *(long *)(piVar8 + 0x1a) << 0x10;
            *(byte **)((long)pvVar23 + 0x188) = pbVar28 + 1;
            *(ssize_t *)((long)pvVar23 + 400) = bytes_avail_1 + -1;
            piVar8[0x1c] = iVar22 + 0x10;
            *(undefined1 *)((long)piVar8 + 0x75) = 0;
          }
LAB_00323027:
          if (*piVar8 < 0x12) {
            piVar9 = *(int **)((long)pvVar23 + 0x1b8);
            br = (lzx_br *)(piVar9 + 0x1a);
            iVar22 = *piVar9;
switchD_00323055_default:
            switch(iVar22) {
            case 0:
              iVar22 = piVar9[0x1c];
              if (iVar22 < 1) {
                wVar16 = lzx_br_fillup(strm,br);
                iVar22 = piVar9[0x1c];
                if (iVar22 < 1 && wVar16 == L'\0') {
                  *piVar9 = 0;
                  goto LAB_00324086;
                }
              }
              uVar43 = iVar22 - 1;
              cVar47 = (*(ulong *)(piVar9 + 0x1a) >> ((ulong)uVar43 & 0x3f) & 1) != 0;
              *(char *)(piVar9 + 10) = cVar47;
              piVar9[0x1c] = uVar43;
              break;
            case 1:
              cVar47 = (char)piVar9[10];
              uVar43 = piVar9[0x1c];
              break;
            case 2:
              uVar43 = piVar9[0x1c];
              goto LAB_003230f0;
            case 3:
              iVar22 = piVar9[0x1c];
              goto LAB_0032313c;
            case 4:
              uVar43 = piVar9[0x1c];
              goto LAB_0032338a;
            case 5:
            case 6:
            case 7:
              goto switchD_00323055_caseD_5;
            case 8:
              goto switchD_00323055_caseD_8;
            case 9:
              goto switchD_00323055_caseD_9;
            case 10:
              goto switchD_00323055_caseD_a;
            case 0xb:
              goto switchD_00323055_caseD_b;
            case 0xc:
              goto switchD_00323055_caseD_c;
            case 0xd:
              goto switchD_00323055_caseD_d;
            case 0xe:
              goto switchD_00323055_caseD_e;
            case 0xf:
              goto switchD_00323055_caseD_f;
            case 0x10:
              goto switchD_00323055_caseD_10;
            case 0x11:
              goto switchD_00323055_caseD_11;
            default:
              goto switchD_00323055_default;
            }
            if (cVar47 != '\0') {
              if ((int)uVar43 < 0x20) {
                wVar16 = lzx_br_fillup(strm,br);
                uVar43 = piVar9[0x1c];
                if ((int)uVar43 < 0x20 && wVar16 == L'\0') {
                  *piVar9 = 1;
                  goto LAB_00324086;
                }
              }
              cVar47 = (char)uVar43;
              uVar43 = uVar43 - 0x20;
              piVar9[9] = (uint)(*(ulong *)(piVar9 + 0x1a) >> ((byte)uVar43 & 0x3f)) & 0xffff |
                          (int)(*(ulong *)(piVar9 + 0x1a) >> (cVar47 - 0x10U & 0x3f)) << 0x10;
              piVar9[0x1c] = uVar43;
            }
LAB_003230f0:
            if ((int)uVar43 < 3) {
              wVar16 = lzx_br_fillup(strm,br);
              uVar43 = piVar9[0x1c];
              if ((int)uVar43 < 3 && wVar16 == L'\0') {
                *piVar9 = 2;
                goto LAB_00324086;
              }
            }
            iVar22 = uVar43 - 3;
            bVar37 = (byte)(*(ulong *)(piVar9 + 0x1a) >> ((byte)iVar22 & 0x3f)) & 7;
            *(byte *)((long)piVar9 + 0x29) = bVar37;
            piVar9[0x1c] = iVar22;
            if (2 < (byte)(bVar37 - 1)) goto LAB_0032408d;
LAB_0032313c:
            if (iVar22 < 0x18) {
              wVar16 = lzx_br_fillup(strm,br);
              iVar22 = piVar9[0x1c];
              if (iVar22 < 0x18 && wVar16 == L'\0') {
                *piVar9 = 3;
                goto LAB_00324086;
              }
            }
            uVar43 = iVar22 - 0x18;
            uVar36 = *(ulong *)(piVar9 + 0x1a) >> ((byte)uVar43 & 0x3f) & 0xffff |
                     (ulong)(((uint)(*(ulong *)(piVar9 + 0x1a) >> ((char)iVar22 - 8U & 0x3f)) & 0xff
                             ) << 0x10);
            *(ulong *)(piVar9 + 0xc) = uVar36;
            piVar9[0x1c] = uVar43;
            if (uVar36 == 0) goto LAB_0032408d;
            *(ulong *)(piVar9 + 0xe) = uVar36;
            iVar22 = 0xb;
            if (*(char *)((long)piVar9 + 0x29) != '\x01') {
              if (*(char *)((long)piVar9 + 0x29) == '\x03') {
LAB_0032338a:
                if ((uVar43 & 0xf) == 0) {
                  if ((int)uVar43 < 0x10) {
                    wVar16 = lzx_br_fillup(strm,br);
                    uVar43 = piVar9[0x1c];
                    if ((int)uVar43 < 0x10 && wVar16 == L'\0') {
                      *piVar9 = 4;
                      goto LAB_00324086;
                    }
                  }
                  uVar43 = uVar43 - 0x10;
                }
                else {
                  uVar43 = uVar43 & 0xfffffff0;
                }
                piVar9[0x1c] = uVar43;
                piVar9[0x14] = 0;
                *piVar9 = 5;
                goto switchD_00323055_caseD_5;
              }
              iVar22 = 10;
            }
            *piVar9 = iVar22;
            goto switchD_00323055_default;
          }
          lVar34 = *(long *)((long)pvVar23 + 0x1a8);
          puVar29 = *(undefined4 **)((long)pvVar23 + 0x1b8);
          local_50 = (ssize_t *)(puVar29 + 0x1a);
          bytes_avail = *(ssize_t *)(puVar29 + 0x1a);
          sStack_c0 = *(ssize_t *)(puVar29 + 0x1c);
          local_60 = *(long *)(puVar29 + 0x18);
          puVar1 = *(undefined1 **)((long)pvVar23 + 0x1a0) + lVar34;
          lVar10 = *(long *)(puVar29 + 4);
          local_68 = *(long *)(puVar29 + 0x30);
          local_58 = *(long *)(puVar29 + 0x4a);
          local_48 = *(long *)(puVar29 + 100);
          local_78 = (long)(int)puVar29[0x32];
          wVar16 = puVar29[0x4c];
          wVar4 = puVar29[0x66];
          uVar17 = puVar29[8];
          cVar47 = *(char *)((long)puVar29 + 0x29);
          uVar41 = puVar29[6];
          uVar5 = puVar29[2];
          local_6c = puVar29[1];
          uVar18 = puVar29[0x15];
          wVar19 = puVar29[0x17];
          local_170 = puVar29[0x16];
          local_184 = puVar29[0x10];
          __dest = *(undefined1 **)((long)pvVar23 + 0x1a0);
          uVar36 = *(ulong *)(puVar29 + 0xe);
          uVar43 = puVar29[7];
          uVar11 = *puVar29;
          uVar32 = puVar29[0x12];
          uVar13 = puVar29[0x11];
switchD_003234d4_default:
          do {
            local_154 = uVar13;
            local_12c = uVar32;
            uVar31 = uVar11;
            uVar45 = uVar43;
            uVar43 = uVar45;
            uVar11 = uVar31;
            uVar32 = local_12c;
            uVar13 = local_154;
            puVar40 = __dest;
            uVar39 = uVar36;
            switch(uVar31) {
            case 0x12:
              lVar46 = 0;
              do {
                uVar39 = uVar36 - lVar46;
                if (uVar39 == 0) {
                  *puVar29 = 2;
                  *local_50 = bytes_avail;
                  local_50[1] = sStack_c0;
                  *(undefined8 *)(puVar29 + 0xe) = 0;
                  puVar29[8] = uVar17;
                  puVar29[7] = uVar45;
                  puVar29[0x15] = uVar18;
                  puVar29[0x16] = local_170;
                  puVar29[0x10] = local_184;
                  puVar29[0x11] = local_154;
                  puVar29[0x12] = local_12c;
                  puVar29[6] = uVar41;
                  *(undefined1 **)((long)pvVar23 + 0x1a8) = puVar1 + (-lVar46 - (long)__dest);
                  uVar43 = 1;
                  goto LAB_00324147;
                }
                puVar40 = __dest + lVar46;
                if (puVar1 <= puVar40) {
LAB_00323f06:
                  uVar31 = 0x12;
                  goto LAB_00323f14;
                }
                if ((wchar_t)sStack_c0 < wVar4) {
                  wVar44 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
                  if ((wVar44 != L'\0') || (wVar4 <= (wchar_t)sStack_c0)) goto LAB_003235ec;
                  if (sVar14 != uVar26) goto LAB_00323f06;
                  uVar15 = *(ushort *)
                            (*(long *)(puVar29 + 0x6a) +
                            (ulong)((uint)(bytes_avail << ((char)wVar4 - (char)sStack_c0 & 0x3fU)) &
                                   cache_masks[wVar4]) * 2);
                  uVar39 = (ulong)uVar15;
                  if ((int)puVar29[0x52] <= (int)(uint)uVar15) {
                    uVar39 = 0;
                  }
                  iVar22 = (wchar_t)sStack_c0 - (uint)*(byte *)(local_48 + uVar39);
                  sStack_c0 = CONCAT44(sStack_c0._4_4_,iVar22);
                  if (iVar22 < 0) goto LAB_0032413a;
                }
                else {
LAB_003235ec:
                  uVar15 = *(ushort *)
                            (*(long *)(puVar29 + 0x6a) +
                            (ulong)((uint)((ulong)bytes_avail >>
                                          ((char)(wchar_t)sStack_c0 - (char)wVar4 & 0x3fU)) &
                                   cache_masks[wVar4]) * 2);
                  uVar39 = (ulong)uVar15;
                  if ((int)puVar29[0x52] <= (int)(uint)uVar15) {
                    uVar39 = 0;
                  }
                  sStack_c0 = CONCAT44(sStack_c0._4_4_,
                                       (wchar_t)sStack_c0 - (uint)*(byte *)(local_48 + uVar39));
                }
                uVar43 = (uint)uVar39;
                if (0xff < uVar43) goto LAB_00323664;
                *(char *)(lVar10 + (int)uVar41) = (char)uVar39;
                uVar41 = uVar41 + 1 & uVar5;
                *puVar40 = (char)uVar39;
                lVar46 = lVar46 + 1;
              } while( true );
            case 0x13:
              goto LAB_0032367a;
            case 0x14:
              goto LAB_0032385d;
            case 0x15:
              uVar43 = local_184;
              goto LAB_00323b4b;
            case 0x16:
              goto LAB_00323b5a;
            }
          } while( true );
        }
        iVar27 = 0;
        goto LAB_003240c0;
      }
      archive_set_error(&a->archive,0x54,"Truncated CAB file data");
      goto LAB_0032445c;
    }
    if ((ulong)*(ushort *)(lVar7 + 6) != 0) {
      pvVar24 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar7 + 6),&bytes_avail);
      if (bytes_avail < 1) {
        truncated_error(a);
      }
      else {
        *(ulong *)(lVar7 + 0x10) = (ulong)*(ushort *)(lVar7 + 6);
        *(void **)(lVar7 + 0x38) = pvVar24;
        iVar27 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar7 + 6));
        if (-1 < iVar27) {
          uVar15 = *(ushort *)(lVar7 + 8);
          goto LAB_003243a8;
        }
      }
LAB_0032445c:
      *avail = -0x1e;
      return (void *)0x0;
    }
LAB_003243a8:
    pvVar24 = *(void **)((long)pvVar23 + 0xa0);
    if ((10 < uVar15) &&
       (lVar34 = *(long *)((long)pvVar23 + 0x1b8), *(char *)(lVar34 + 0x28) != '\0')) {
      iVar22 = *(int *)(*(long *)((long)pvVar23 + 0x28) + 0x58);
      pvVar42 = (void *)((long)pvVar24 + ((ulong)uVar15 - 10));
      pvVar30 = pvVar24;
      while ((pvVar30 < pvVar42 &&
             (pvVar30 = memchr(pvVar30,0xe8,(long)pvVar42 - (long)pvVar30), pvVar30 != (void *)0x0))
            ) {
        iVar33 = ((int)pvVar24 - (int)pvVar30) + iVar22 * -0x8000 + 0x8000;
        iVar38 = *(int *)((long)pvVar30 + 1);
        if ((iVar33 <= iVar38) && (iVar6 = *(int *)(lVar34 + 0x24), iVar38 < iVar6)) {
          if (iVar38 < 0) {
            iVar33 = iVar6;
          }
          *(int *)((long)pvVar30 + 1) = iVar33 + iVar38;
        }
        pvVar30 = (void *)((long)pvVar30 + 5);
      }
      pvVar24 = *(void **)((long)pvVar23 + 0xa0);
    }
    uVar15 = *(ushort *)(lVar7 + 0xe);
    *avail = (uVar26 & 0xffff) - (ulong)uVar15;
    *(short *)(lVar7 + 0xc) = (short)uVar26;
    return (void *)((long)pvVar24 + (ulong)uVar15);
  }
  if (sVar3 == 1) {
    pvVar23 = a->format->data;
    lVar7 = *(long *)((long)pvVar23 + 0x38);
    pvVar24 = *(void **)((long)pvVar23 + 0xa0);
    if (pvVar24 == (void *)0x0) {
      *(undefined8 *)((long)pvVar23 + 0xa8) = 0x8000;
      pvVar24 = malloc(0x8000);
      *(void **)((long)pvVar23 + 0xa0) = pvVar24;
      if (pvVar24 != (void *)0x0) goto LAB_00322c5b;
      pcVar25 = "No memory for CAB reader";
      iVar22 = 0xc;
LAB_00324498:
      archive_set_error(&a->archive,iVar22,pcVar25);
LAB_0032449f:
      *avail = -0x1e;
      return (void *)0x0;
    }
LAB_00322c5b:
    uVar26 = (ulong)*(ushort *)(lVar7 + 0xc);
    if (*(ushort *)(lVar7 + 0xc) == *(ushort *)(lVar7 + 8)) {
      uVar15 = *(ushort *)(lVar7 + 0xe);
      *avail = uVar26 - uVar15;
      return (void *)((long)pvVar24 + (ulong)uVar15);
    }
    if (*(char *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) == '\0') {
      *(undefined8 *)((long)pvVar23 + 0x110) = 0;
      *(undefined4 *)((long)pvVar23 + 0x118) = 0;
      *(undefined8 *)((long)pvVar23 + 0x138) = 0;
      *(undefined4 *)((long)pvVar23 + 0x130) = 0;
      *(undefined8 *)((long)pvVar23 + 0x120) = 0;
      *(undefined8 *)((long)pvVar23 + 0x128) = 0;
      if (*(char *)((long)pvVar23 + 0x180) == '\0') {
        iVar22 = cm_zlib_inflateInit2_((z_streamp)((long)pvVar23 + 0x110),-0xf,"1.2.3",0x70);
      }
      else {
        iVar22 = cm_zlib_inflateReset((z_streamp)((long)pvVar23 + 0x110));
      }
      if (iVar22 != 0) {
        pcVar25 = "Can\'t initialize deflate decompression.";
LAB_0032448d:
        iVar22 = -1;
        goto LAB_00324498;
      }
      *(undefined1 *)((long)pvVar23 + 0x180) = 1;
      *(undefined1 *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) = 1;
    }
    uVar43 = (uint)(*(short *)(lVar7 + 6) == *(short *)(lVar7 + 4)) * 2;
    strm_00 = (z_streamp)((long)pvVar23 + 0x110);
    *(ulong *)((long)pvVar23 + 0x138) = uVar26;
    bVar12 = false;
    while( true ) {
      uVar15 = *(ushort *)(lVar7 + 8);
      if ((bVar12) || (uVar15 <= uVar26)) break;
      *(ulong *)((long)pvVar23 + 0x128) = *(long *)((long)pvVar23 + 0xa0) + uVar26;
      *(uint *)((long)pvVar23 + 0x130) = (uint)uVar15 - (int)uVar26;
      pcVar25 = (char *)__archive_read_ahead(a,1,&bytes_avail);
      if (bytes_avail < 1) goto LAB_00324190;
      if ((ulong)*(ushort *)(lVar7 + 6) < (ulong)bytes_avail) {
        bytes_avail = (ulong)*(ushort *)(lVar7 + 6);
      }
      *(char **)((long)pvVar23 + 0x110) = pcVar25;
      *(int *)((long)pvVar23 + 0x118) = (int)bytes_avail;
      *(undefined8 *)((long)pvVar23 + 0x120) = 0;
      if (0 < (int)uVar43) {
        if (bytes_avail != 0) {
          uVar26 = (ulong)uVar43;
          if ((ulong)bytes_avail <= uVar26) {
            cVar47 = *pcVar25;
            if (uVar43 == 2) {
              if (cVar47 != 'C') goto LAB_00324346;
              if (bytes_avail != 1) {
                cVar47 = pcVar25[1];
                goto joined_r0x00322eb1;
              }
            }
            else {
joined_r0x00322eb1:
              if (cVar47 != 'K') goto LAB_00324346;
            }
            *(ssize_t *)(lVar7 + 0x10) = bytes_avail;
            *(char **)(lVar7 + 0x38) = pcVar25;
            iVar27 = cab_minimum_consume_cfdata(a,bytes_avail);
            if (-1 < iVar27) {
              uVar43 = uVar43 - (int)bytes_avail;
              bVar12 = false;
              goto LAB_00322edd;
            }
            goto LAB_00324195;
          }
          if (((uVar43 != 1) && (*pcVar25 == 'C')) && (pcVar25[1] == 'K')) {
            *(char **)((long)pvVar23 + 0x110) = pcVar25 + uVar26;
            *(uint *)((long)pvVar23 + 0x118) = (int)bytes_avail - uVar43;
            *(ulong *)((long)pvVar23 + 0x120) = uVar26;
            uVar43 = 0;
            goto LAB_00322e4a;
          }
        }
LAB_00324346:
        pcVar25 = "CFDATA incorrect(no MSZIP signature)";
        goto LAB_0032448d;
      }
LAB_00322e4a:
      bVar12 = false;
      uVar17 = cm_zlib_inflate(strm_00,0);
      if (uVar17 != 0) {
        if (uVar17 != 1) goto LAB_0032454e;
        bVar12 = true;
      }
      iVar27 = *(int64_t *)((long)pvVar23 + 0x120);
      *(int64_t *)(lVar7 + 0x10) = iVar27;
      *(char **)(lVar7 + 0x38) = pcVar25;
      iVar27 = cab_minimum_consume_cfdata(a,iVar27);
      if (iVar27 < 0) goto LAB_00324195;
LAB_00322edd:
      uVar26 = *(ulong *)((long)pvVar23 + 0x138);
    }
    uVar36 = uVar26 & 0xffff;
    if ((uint)uVar36 < (uint)uVar15) {
      archive_set_error(&a->archive,-1,"Invalid uncompressed size (%d < %d)",uVar36);
      goto LAB_0032449f;
    }
    if ((ulong)*(ushort *)(lVar7 + 6) != 0) {
      pvVar24 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar7 + 6),&bytes_avail);
      if (bytes_avail < 1) goto LAB_00324190;
      *(ulong *)(lVar7 + 0x10) = (ulong)*(ushort *)(lVar7 + 6);
      *(void **)(lVar7 + 0x38) = pvVar24;
      iVar27 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar7 + 6));
      if (iVar27 < 0) goto LAB_00324195;
    }
    if (((int)(uint)*(ushort *)(*(long *)((long)pvVar23 + 0x28) + 4) <=
         *(int *)(*(long *)((long)pvVar23 + 0x28) + 0x58)) ||
       ((uVar17 = cm_zlib_inflateReset(strm_00), uVar17 == 0 &&
        (uVar17 = cm_zlib_inflateSetDictionary
                            (strm_00,*(Bytef **)((long)pvVar23 + 0xa0),(uint)*(ushort *)(lVar7 + 8))
        , uVar17 == 0)))) {
      uVar15 = *(ushort *)(lVar7 + 0xe);
      lVar34 = *(long *)((long)pvVar23 + 0xa0);
      *avail = uVar36 - uVar15;
      *(short *)(lVar7 + 0xc) = (short)uVar26;
      return (void *)((ulong)uVar15 + lVar34);
    }
LAB_0032454e:
    if (uVar17 == 0xfffffffc) {
      archive_set_error(&a->archive,0xc,"Out of memory for deflate decompression");
    }
    else {
      archive_set_error(&a->archive,-1,"Deflate decompression failed (%d)",(ulong)uVar17);
    }
  }
  else {
    if (sVar3 != 0) {
      archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                        *(undefined8 *)(lVar7 + 0x10));
      *avail = -0x19;
      return (void *)0x0;
    }
    lVar7 = *(long *)((long)a->format->data + 0x38);
    pvVar23 = __archive_read_ahead(a,1,avail);
    uVar26 = *avail;
    if (0 < (long)uVar26) {
      uVar36 = (ulong)*(ushort *)(lVar7 + 10);
      if (uVar36 < uVar26) {
        *avail = uVar36;
        uVar26 = uVar36;
      }
      *(undefined2 *)(lVar7 + 0xc) = *(undefined2 *)(lVar7 + 8);
      *(ulong *)(lVar7 + 0x10) = uVar26;
      *(void **)(lVar7 + 0x38) = pvVar23;
      return pvVar23;
    }
LAB_00324190:
    truncated_error(a);
  }
LAB_00324195:
  *avail = -0x1e;
  return (void *)0x0;
switchD_00323055_caseD_a:
  if (((piVar9[0x1c] < piVar9[0x1e] * 3) && (wVar16 = lzx_br_fillup(strm,br), wVar16 == L'\0')) &&
     (piVar9[0x1c] < piVar9[0x1e] * 3)) {
    *piVar9 = 10;
    goto LAB_00324086;
  }
  piVar9[0x2b] = 0;
  piVar9[0x2c] = 0;
  piVar9[0x2d] = 0;
  piVar9[0x2e] = 0;
  piVar9[0x27] = 0;
  piVar9[0x28] = 0;
  piVar9[0x29] = 0;
  piVar9[0x2a] = 0;
  piVar9[0x23] = 0;
  piVar9[0x24] = 0;
  piVar9[0x25] = 0;
  piVar9[0x26] = 0;
  piVar9[0x1f] = 0;
  piVar9[0x20] = 0;
  piVar9[0x21] = 0;
  piVar9[0x22] = 0;
  piVar9[0x2f] = 0;
  for (lVar34 = 0; lVar34 < ((huffman *)(piVar9 + 0x1e))->len_size; lVar34 = lVar34 + 1) {
    *(byte *)(*(long *)(piVar9 + 0x30) + lVar34) =
         (byte)(*(ulong *)(piVar9 + 0x1a) >> ((char)piVar9[0x1c] - 3U & 0x3f)) & 7;
    piVar9[(ulong)*(byte *)(*(long *)(piVar9 + 0x30) + lVar34) + 0x1f] =
         piVar9[(ulong)*(byte *)(*(long *)(piVar9 + 0x30) + lVar34) + 0x1f] + 1;
    piVar9[0x1c] = piVar9[0x1c] + -3;
  }
  wVar16 = lzx_make_huffman_table((huffman *)(piVar9 + 0x1e));
  if (wVar16 == L'\0') goto LAB_0032408d;
switchD_00323055_caseD_b:
  piVar9[0x86] = 0;
switchD_00323055_caseD_c:
  wVar16 = lzx_read_pre_tree(strm);
  if (wVar16 == L'\0') {
    *piVar9 = 0xc;
    goto LAB_00324086;
  }
  wVar16 = lzx_make_huffman_table((huffman *)(piVar9 + 0x6c));
  if (wVar16 == L'\0') goto LAB_0032408d;
  piVar9[0x86] = 0;
switchD_00323055_caseD_d:
  wVar16 = lzx_read_bitlen(strm,(huffman *)(piVar9 + 0x52),L'Ā');
  if (wVar16 < L'\0') goto LAB_0032408d;
  if (wVar16 == L'\0') {
    *piVar9 = 0xd;
    goto LAB_00324086;
  }
  piVar9[0x86] = 0;
switchD_00323055_caseD_e:
  wVar16 = lzx_read_pre_tree(strm);
  if (wVar16 == L'\0') {
    *piVar9 = 0xe;
    goto LAB_00324086;
  }
  wVar16 = lzx_make_huffman_table((huffman *)(piVar9 + 0x6c));
  if (wVar16 == L'\0') goto LAB_0032408d;
  piVar9[0x86] = 0x100;
switchD_00323055_caseD_f:
  wVar16 = lzx_read_bitlen(strm,(huffman *)(piVar9 + 0x52),L'\xffffffff');
  if (wVar16 < L'\0') goto LAB_0032408d;
  if (wVar16 == L'\0') {
    *piVar9 = 0xf;
    goto LAB_00324086;
  }
  wVar16 = lzx_make_huffman_table((huffman *)(piVar9 + 0x52));
  if (wVar16 == L'\0') goto LAB_0032408d;
  piVar9[0x86] = 0;
switchD_00323055_caseD_10:
  wVar16 = lzx_read_pre_tree(strm);
  if (wVar16 == L'\0') {
    *piVar9 = 0x10;
    goto LAB_00324086;
  }
  wVar16 = lzx_make_huffman_table((huffman *)(piVar9 + 0x6c));
  if (wVar16 == L'\0') goto LAB_0032408d;
  piVar9[0x86] = 0;
switchD_00323055_caseD_11:
  wVar16 = lzx_read_bitlen(strm,(huffman *)(piVar9 + 0x38),L'\xffffffff');
  if (wVar16 < L'\0') goto LAB_0032408d;
  if (wVar16 == L'\0') {
    *piVar9 = 0x11;
    goto LAB_00324086;
  }
  wVar16 = lzx_make_huffman_table((huffman *)(piVar9 + 0x38));
  if (wVar16 == L'\0') goto LAB_0032408d;
  *piVar9 = 0x12;
  goto LAB_00323027;
  while (iVar22 != 8) {
switchD_00323055_caseD_5:
    iVar22 = piVar9[0x1c];
    if (iVar22 < 0x20) {
      if (iVar22 < 0x10) {
        iVar22 = piVar9[0x14];
        if (3 < iVar22) goto LAB_00323d6e;
      }
      else {
        uVar36 = *(ulong *)(piVar9 + 0x1a) >> ((byte)(iVar22 + -0x10) & 0x3f);
        piVar9[0x1c] = iVar22 + -0x10;
        *(char *)(piVar9 + 0x13) = (char)uVar36;
        *(char *)((long)piVar9 + 0x4d) = (char)(uVar36 >> 8);
        piVar9[0x14] = 2;
        iVar22 = 2;
      }
      if (*(char *)((long)piVar9 + 0x75) != '\0') {
        piVar9[0x14] = iVar22 + 1;
        *(char *)((long)piVar9 + (long)iVar22 + 0x4c) = (char)piVar9[0x1d];
        *(undefined1 *)((long)piVar9 + 0x75) = 0;
      }
    }
    else {
      uVar36 = *(ulong *)(piVar9 + 0x1a) >> ((char)iVar22 - 0x10U & 0x3f);
      *(char *)(piVar9 + 0x13) = (char)uVar36;
      *(char *)((long)piVar9 + 0x4d) = (char)(uVar36 >> 8);
      uVar36 = *(ulong *)(piVar9 + 0x1a) >> ((byte)(iVar22 + -0x20) & 0x3f);
      piVar9[0x1c] = iVar22 + -0x20;
      *(char *)((long)piVar9 + 0x4e) = (char)uVar36;
      *(char *)((long)piVar9 + 0x4f) = (char)(uVar36 >> 8);
      piVar9[0x14] = 4;
    }
LAB_00323d6e:
    while( true ) {
      iVar22 = piVar9[0x14];
      if (3 < (long)iVar22) break;
      if (*(long *)((long)pvVar23 + 400) < 1) goto LAB_00324086;
      puVar1 = *(undefined1 **)((long)pvVar23 + 0x188);
      *(undefined1 **)((long)pvVar23 + 0x188) = puVar1 + 1;
      uVar2 = *puVar1;
      piVar9[0x14] = iVar22 + 1;
      *(undefined1 *)((long)piVar9 + (long)iVar22 + 0x4c) = uVar2;
      *(long *)((long)pvVar23 + 400) = *(long *)((long)pvVar23 + 400) + -1;
    }
    piVar9[0x14] = 0;
    iVar22 = *piVar9;
    if (iVar22 == 5) {
      iVar38 = piVar9[0x13];
      piVar9[0x10] = iVar38;
      iVar22 = 6;
LAB_00323dda:
      if (iVar38 < 0) goto LAB_0032408d;
      *piVar9 = iVar22;
    }
    else {
      if (iVar22 == 6) {
        iVar38 = piVar9[0x13];
        piVar9[0x11] = iVar38;
        iVar22 = 7;
        goto LAB_00323dda;
      }
      if (iVar22 == 7) {
        piVar9[0x12] = piVar9[0x13];
        if (piVar9[0x13] < 0) goto LAB_0032408d;
        *piVar9 = 8;
        break;
      }
    }
  }
switchD_00323055_caseD_8:
  lVar34 = *(long *)(piVar9 + 0xe);
  while (lVar34 != 0) {
    uVar36 = *(ulong *)((long)pvVar23 + 0x1a8);
    uVar43 = 0;
    if ((long)uVar36 < 1) goto LAB_0032409e;
    uVar39 = *(ulong *)((long)pvVar23 + 400);
    if ((long)uVar39 < 1) {
      uVar43 = 0;
      if (sVar14 == uVar26) goto LAB_0032408d;
      goto LAB_0032409e;
    }
    uVar43 = piVar9[1] - piVar9[6];
    if ((int)(uint)lVar34 <= piVar9[1] - piVar9[6]) {
      uVar43 = (uint)lVar34;
    }
    if ((long)(int)uVar43 <= (long)uVar36) {
      uVar36 = (ulong)uVar43;
    }
    if ((long)(int)uVar36 <= (long)uVar39) {
      uVar39 = uVar36 & 0xffffffff;
    }
    __n = (size_t)(int)uVar39;
    memcpy(*(void **)((long)pvVar23 + 0x1a0),*(void **)((long)pvVar23 + 0x188),__n);
    memcpy((void *)((long)piVar9[6] + *(long *)(piVar9 + 4)),*(void **)((long)pvVar23 + 0x188),__n);
    *(long *)((long)pvVar23 + 0x188) = *(long *)((long)pvVar23 + 0x188) + __n;
    *(long *)((long)pvVar23 + 400) = *(long *)((long)pvVar23 + 400) - __n;
    *(long *)((long)pvVar23 + 0x1a0) = *(long *)((long)pvVar23 + 0x1a0) + __n;
    *(long *)((long)pvVar23 + 0x1a8) = *(long *)((long)pvVar23 + 0x1a8) - __n;
    *(long *)((long)pvVar23 + 0x1b0) = *(long *)((long)pvVar23 + 0x1b0) + __n;
    piVar9[6] = piVar9[6] + (int)uVar39 & piVar9[2];
    lVar34 = *(long *)(piVar9 + 0xe) - __n;
    *(long *)(piVar9 + 0xe) = lVar34;
  }
switchD_00323055_caseD_9:
  if ((*(byte *)(piVar9 + 0xc) & 1) != 0) {
    if (*(long *)((long)pvVar23 + 400) < 1) {
      *piVar9 = 9;
LAB_00324086:
      if (sVar14 == uVar26) {
LAB_0032408d:
        piVar9[0x87] = -0x19;
        uVar43 = 0xffffffe7;
      }
      else {
        uVar43 = 0;
      }
      goto LAB_0032409e;
    }
    *(long *)((long)pvVar23 + 0x188) = *(long *)((long)pvVar23 + 0x188) + 1;
    *(long *)((long)pvVar23 + 400) = *(long *)((long)pvVar23 + 400) + -1;
  }
  *piVar9 = 2;
  uVar43 = 1;
  goto LAB_0032409e;
LAB_00323664:
  uVar18 = uVar43 & 7;
  local_170 = uVar43 - 0x100 >> 3;
  uVar39 = uVar36 - lVar46;
  puVar40 = __dest + lVar46;
LAB_0032367a:
  if (uVar18 == 7) {
    if ((wchar_t)sStack_c0 < wVar16) {
      wVar44 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar44 != L'\0') || (wVar16 <= (wchar_t)sStack_c0)) goto LAB_00323785;
      if (sVar14 != uVar26) {
        uVar18 = 7;
        uVar31 = 0x13;
        goto LAB_00323f14;
      }
      uVar15 = *(ushort *)
                (*(long *)(puVar29 + 0x50) +
                (ulong)((uint)(bytes_avail << ((char)wVar16 - (char)sStack_c0 & 0x3fU)) &
                       cache_masks[wVar16]) * 2);
      uVar36 = (ulong)uVar15;
      if ((int)puVar29[0x38] <= (int)(uint)uVar15) {
        uVar36 = 0;
      }
      iVar22 = (int)uVar36;
      iVar38 = (wchar_t)sStack_c0 - (uint)*(byte *)(local_58 + uVar36);
      sStack_c0 = CONCAT44(sStack_c0._4_4_,iVar38);
      if (iVar38 < 0) goto LAB_0032413a;
    }
    else {
LAB_00323785:
      uVar15 = *(ushort *)
                (*(long *)(puVar29 + 0x50) +
                (ulong)((uint)((ulong)bytes_avail >>
                              ((char)(wchar_t)sStack_c0 - (char)wVar16 & 0x3fU)) &
                       cache_masks[wVar16]) * 2);
      uVar36 = (ulong)uVar15;
      if ((int)puVar29[0x38] <= (int)(uint)uVar15) {
        uVar36 = 0;
      }
      iVar22 = (int)uVar36;
      sStack_c0 = CONCAT44(sStack_c0._4_4_,(wchar_t)sStack_c0 - (uint)*(byte *)(local_58 + uVar36));
    }
    uVar17 = iVar22 + 9;
  }
  else {
    uVar17 = uVar18 + 2;
  }
  if (uVar39 < (ulong)(long)(int)uVar17) goto LAB_0032413a;
  __dest = puVar40;
  uVar36 = uVar39;
  uVar43 = local_184;
  uVar11 = 0x15;
  if (local_170 == 0) goto switchD_003234d4_default;
  if (local_170 == 2) {
    local_170 = 2;
    uVar43 = local_12c;
    uVar11 = 0x15;
    uVar32 = local_184;
    local_184 = local_12c;
    goto switchD_003234d4_default;
  }
  if (local_170 == 1) {
    local_170 = 1;
    uVar43 = local_154;
    uVar11 = 0x15;
    uVar13 = local_184;
    local_184 = local_154;
    goto switchD_003234d4_default;
  }
  wVar19 = *(wchar_t *)(local_60 + 4 + (long)(int)local_170 * 8);
LAB_0032385d:
  if ((cVar47 == '\x02') && (L'\x02' < wVar19)) {
    wVar44 = wVar19 + L'\xfffffffd';
    if ((wchar_t)sStack_c0 < wVar44) {
      wVar20 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar20 == L'\0') && ((wchar_t)sStack_c0 < wVar44)) {
joined_r0x00324134:
        uVar31 = 0x14;
        if (sVar14 == uVar26) goto LAB_0032413a;
        goto LAB_00323f14;
      }
    }
    iVar22 = (wchar_t)sStack_c0 - wVar44;
    uVar45 = ((uint)((ulong)bytes_avail >> ((byte)iVar22 & 0x3f)) & cache_masks[(uint)wVar44]) * 8;
    wVar20 = (int)local_78 + wVar44;
    if ((wchar_t)sStack_c0 < wVar20) {
      wVar21 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar21 != L'\0') || (wVar20 <= (wchar_t)sStack_c0)) {
        iVar22 = (wchar_t)sStack_c0 - wVar44;
        goto LAB_00323ace;
      }
      if (sVar14 != uVar26) {
        uVar31 = 0x14;
        goto LAB_00323f14;
      }
      uVar15 = *(ushort *)
                (*(long *)(puVar29 + 0x36) +
                (ulong)((uint)(bytes_avail <<
                              ((char)local_78 - (char)((wchar_t)sStack_c0 - wVar44) & 0x3fU)) &
                       cache_masks[local_78]) * 2);
      uVar36 = (ulong)uVar15;
      if ((int)puVar29[0x1e] <= (int)(uint)uVar15) {
        uVar36 = 0;
      }
      iVar22 = ((wchar_t)sStack_c0 - wVar44) - (uint)*(byte *)(local_68 + uVar36);
      sStack_c0 = CONCAT44(sStack_c0._4_4_,iVar22);
      if (iVar22 < 0) goto LAB_0032413a;
    }
    else {
LAB_00323ace:
      uVar15 = *(ushort *)
                (*(long *)(puVar29 + 0x36) +
                (ulong)((uint)((ulong)bytes_avail >> ((char)iVar22 - (char)local_78 & 0x3fU)) &
                       cache_masks[local_78]) * 2);
      uVar36 = (ulong)uVar15;
      if ((int)puVar29[0x1e] <= (int)(uint)uVar15) {
        uVar36 = 0;
      }
      sStack_c0 = CONCAT44(sStack_c0._4_4_,iVar22 - (uint)*(byte *)(local_68 + uVar36));
    }
    uVar45 = (int)uVar36 + uVar45;
  }
  else {
    if ((wchar_t)sStack_c0 < wVar19) {
      wVar44 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar44 == L'\0') && ((wchar_t)sStack_c0 < wVar19)) goto joined_r0x00324134;
    }
    uVar45 = (uint)((ulong)bytes_avail >> ((byte)((wchar_t)sStack_c0 - wVar19) & 0x3f)) &
             cache_masks[wVar19];
    sStack_c0 = CONCAT44(sStack_c0._4_4_,(wchar_t)sStack_c0 - wVar19);
  }
  uVar43 = (uVar45 + *(int *)(local_60 + (long)(int)local_170 * 8)) - 2;
  local_12c = local_154;
  __dest = puVar40;
  uVar36 = uVar39;
  uVar45 = uVar43;
  local_154 = local_184;
LAB_00323b4b:
  uVar45 = uVar41 - uVar45 & uVar5;
  local_184 = uVar43;
LAB_00323b5a:
  do {
    uVar43 = uVar41;
    if ((int)uVar41 < (int)uVar45) {
      uVar43 = uVar45;
    }
    uVar32 = local_6c - uVar43;
    if ((int)uVar17 < (int)(local_6c - uVar43)) {
      uVar32 = uVar17;
    }
    if (puVar1 <= __dest + (int)uVar32) {
      uVar32 = (int)puVar1 - (int)__dest;
    }
    pvVar24 = (void *)((int)uVar45 + lVar10);
    if (((int)uVar32 < 8) ||
       (((int)uVar41 <= (int)(uVar45 + uVar32) && ((int)uVar45 <= (int)(uVar41 + uVar32))))) {
      uVar39 = 0;
      if (0 < (int)uVar32) {
        uVar39 = (ulong)uVar32;
      }
      for (uVar35 = 0; uVar39 != uVar35; uVar35 = uVar35 + 1) {
        uVar2 = *(undefined1 *)((long)pvVar24 + uVar35);
        *(undefined1 *)((int)uVar41 + lVar10 + uVar35) = uVar2;
        __dest[uVar35] = uVar2;
      }
    }
    else {
      memcpy((void *)((int)uVar41 + lVar10),pvVar24,(ulong)uVar32);
      memcpy(__dest,pvVar24,(ulong)uVar32);
    }
    puVar40 = __dest + (int)uVar32;
    uVar45 = uVar45 + uVar32 & uVar5;
    uVar41 = uVar41 + uVar32 & uVar5;
    uVar39 = uVar36 - (long)(int)uVar32;
    uVar11 = 0x16;
    if (puVar40 < puVar1) {
      uVar11 = uVar31;
    }
    iVar22 = 7;
    if (puVar40 < puVar1) {
      iVar22 = 0;
    }
    uVar13 = uVar32;
    if ((int)uVar17 <= (int)uVar32) {
      uVar11 = uVar31;
      uVar13 = 0;
    }
    uVar31 = uVar11;
    uVar43 = 10;
    if ((int)uVar17 <= (int)uVar32) {
      iVar22 = 10;
    }
    uVar17 = uVar17 - uVar13;
    __dest = puVar40;
    uVar36 = uVar39;
  } while (iVar22 == 0);
  if (iVar22 != 7) {
    if (iVar22 != 10) goto LAB_00324147;
    uVar43 = uVar45;
    uVar11 = 0x12;
    uVar32 = local_12c;
    uVar13 = local_154;
    goto switchD_003234d4_default;
  }
LAB_00323f14:
  *local_50 = bytes_avail;
  local_50[1] = sStack_c0;
  *(ulong *)(puVar29 + 0xe) = uVar39;
  puVar29[8] = uVar17;
  puVar29[7] = uVar45;
  puVar29[0x15] = uVar18;
  puVar29[0x17] = wVar19;
  puVar29[0x16] = local_170;
  puVar29[0x10] = local_184;
  puVar29[0x11] = local_154;
  puVar29[0x12] = local_12c;
  *puVar29 = uVar31;
  puVar29[6] = uVar41;
  *(long *)((long)pvVar23 + 0x1a8) = (long)puVar1 - (long)puVar40;
  uVar43 = 0;
  goto LAB_00324147;
LAB_0032413a:
  puVar29[0x87] = 0xffffffe7;
  uVar43 = 0xffffffe7;
LAB_00324147:
  lVar34 = lVar34 - *(long *)((long)pvVar23 + 0x1a8);
  *(long *)((long)pvVar23 + 0x1a0) = *(long *)((long)pvVar23 + 0x1a0) + lVar34;
  *(long *)((long)pvVar23 + 0x1b0) = *(long *)((long)pvVar23 + 0x1b0) + lVar34;
LAB_0032409e:
  iVar27 = (sVar14 - *(long *)((long)pvVar23 + 400)) + *(long *)((long)pvVar23 + 0x198);
  *(int64_t *)((long)pvVar23 + 0x198) = iVar27;
  pbVar28 = local_40;
LAB_003240c0:
  if (1 < uVar43) {
    archive_set_error(&a->archive,-1,"LZX decompression failed (%d)");
    goto LAB_0032445c;
  }
  *(int64_t *)(lVar7 + 0x10) = iVar27;
  *(byte **)(lVar7 + 0x38) = pbVar28;
  iVar27 = cab_minimum_consume_cfdata(a,iVar27);
  if (iVar27 < 0) goto LAB_0032445c;
  uVar26 = *(ulong *)((long)pvVar23 + 0x1b0);
  goto LAB_00322f1f;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}